

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledStreamWriter::write(StyledStreamWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  Value *in_stack_00000048;
  StyledStreamWriter *in_stack_00000050;
  Value *in_stack_00000228;
  StyledStreamWriter *in_stack_00000230;
  
  this->document_ = (ostream *)CONCAT44(in_register_00000034,__fd);
  this->field_0x68 = this->field_0x68 & 0xfe;
  std::__cxx11::string::operator=((string *)&this->indentString_,"");
  this->field_0x68 = this->field_0x68 & 0xfd | 2;
  writeCommentBeforeValue(in_stack_00000050,in_stack_00000048);
  if (((byte)this->field_0x68 >> 1 & 1) == 0) {
    writeIndent(this);
  }
  this->field_0x68 = this->field_0x68 & 0xfd | 2;
  writeValue(in_stack_00000230,in_stack_00000228);
  writeCommentAfterValueOnSameLine(in_stack_00000050,in_stack_00000048);
  std::operator<<(this->document_,"\n");
  this->document_ = (ostream *)0x0;
  return (ssize_t)this;
}

Assistant:

void StyledStreamWriter::write(std::ostream& out, const Value& root) {
  document_ = &out;
  addChildValues_ = false;
  indentString_ = "";
  indented_ = true;
  writeCommentBeforeValue(root);
  if (!indented_) writeIndent();
  indented_ = true;
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  *document_ << "\n";
  document_ = NULL; // Forget the stream, for safety.
}